

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read.c
# Opt level: O1

ssize_t archive_read_data(archive *_a,void *buff,size_t s)

{
  long lVar1;
  int iVar2;
  char *pcVar3;
  size_t __n;
  char *__n_00;
  char *pcVar4;
  undefined1 auVar5 [16];
  void *read_buf;
  void *local_40;
  char **local_38;
  
  if (s == 0) {
    pcVar4 = (char *)0x0;
  }
  else {
    local_38 = &_a[1].compression_name;
    pcVar4 = (char *)0x0;
    do {
      if (_a[1].error == (char *)0x0) {
        local_40 = *(void **)&_a[1].compression_code;
        *(undefined1 *)&_a[1].error_string.s = 1;
        _a[1].error_string.length = s;
        iVar2 = _archive_read_data_block(_a,&local_40,(size_t *)&_a[1].error,(int64_t *)local_38);
        *(void **)&_a[1].compression_code = local_40;
        if (iVar2 == 1) {
          return (ssize_t)pcVar4;
        }
        if (iVar2 < 0) {
          return (ssize_t)(char *)(long)iVar2;
        }
      }
      pcVar3 = _a[1].compression_name;
      lVar1 = *(long *)&_a[1].file_count;
      if ((long)pcVar3 < lVar1) {
        archive_set_error(_a,0x54,"Encountered out-of-order sparse blocks");
        return (ssize_t)(char *)0xfffffffffffffff6;
      }
      __n = (long)pcVar3 - lVar1;
      if (__n == 0 || (long)pcVar3 < lVar1) {
        __n = 0;
      }
      if ((long)(lVar1 + s) < (long)pcVar3) {
        __n = s;
      }
      memset(buff,0,__n);
      *(size_t *)&_a[1].file_count = *(long *)&_a[1].file_count + __n;
      buff = (void *)((long)buff + __n);
      pcVar4 = pcVar4 + __n;
      pcVar3 = (char *)(s - __n);
      if (pcVar3 == (char *)0x0) {
        s = 0;
      }
      else {
        __n_00 = _a[1].error;
        if (pcVar3 <= _a[1].error) {
          __n_00 = pcVar3;
        }
        memcpy(buff,*(void **)&_a[1].compression_code,(size_t)__n_00);
        *(char **)&_a[1].compression_code = __n_00 + *(long *)&_a[1].compression_code;
        _a[1].error = _a[1].error + -(long)__n_00;
        s = (long)pcVar3 - (long)__n_00;
        auVar5._8_4_ = (int)__n_00;
        auVar5._0_8_ = __n_00;
        auVar5._12_4_ = (int)((ulong)__n_00 >> 0x20);
        _a[1].compression_name = __n_00 + (long)_a[1].compression_name;
        *(long *)&_a[1].file_count = auVar5._8_8_ + *(long *)&_a[1].file_count;
        buff = (void *)((long)buff + (long)__n_00);
        pcVar4 = pcVar4 + (long)__n_00;
      }
    } while (s != 0);
  }
  *(undefined1 *)&_a[1].error_string.s = 0;
  _a[1].error_string.length = 0;
  return (ssize_t)pcVar4;
}

Assistant:

ssize_t
archive_read_data(struct archive *_a, void *buff, size_t s)
{
	struct archive_read *a = (struct archive_read *)_a;
	char	*dest;
	const void *read_buf;
	size_t	 bytes_read;
	size_t	 len;
	int	 r;

	bytes_read = 0;
	dest = (char *)buff;

	while (s > 0) {
		if (a->read_data_remaining == 0) {
			read_buf = a->read_data_block;
			a->read_data_is_posix_read = 1;
			a->read_data_requested = s;
			r = _archive_read_data_block(&a->archive, &read_buf,
			    &a->read_data_remaining, &a->read_data_offset);
			a->read_data_block = read_buf;
			if (r == ARCHIVE_EOF)
				return (bytes_read);
			/*
			 * Error codes are all negative, so the status
			 * return here cannot be confused with a valid
			 * byte count.  (ARCHIVE_OK is zero.)
			 */
			if (r < ARCHIVE_OK)
				return (r);
		}

		if (a->read_data_offset < a->read_data_output_offset) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
			    "Encountered out-of-order sparse blocks");
			return (ARCHIVE_RETRY);
		}

		/* Compute the amount of zero padding needed. */
		if (a->read_data_output_offset + (int64_t)s <
		    a->read_data_offset) {
			len = s;
		} else if (a->read_data_output_offset <
		    a->read_data_offset) {
			len = (size_t)(a->read_data_offset -
			    a->read_data_output_offset);
		} else
			len = 0;

		/* Add zeroes. */
		memset(dest, 0, len);
		s -= len;
		a->read_data_output_offset += len;
		dest += len;
		bytes_read += len;

		/* Copy data if there is any space left. */
		if (s > 0) {
			len = a->read_data_remaining;
			if (len > s)
				len = s;
			memcpy(dest, a->read_data_block, len);
			s -= len;
			a->read_data_block += len;
			a->read_data_remaining -= len;
			a->read_data_output_offset += len;
			a->read_data_offset += len;
			dest += len;
			bytes_read += len;
		}
	}
	a->read_data_is_posix_read = 0;
	a->read_data_requested = 0;
	return (bytes_read);
}